

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O1

int main(void)

{
  block_t *pbVar1;
  undefined1 auVar2 [16];
  TerminalInfo term_00;
  long lVar3;
  pointer pbVar4;
  pointer pbVar5;
  long y;
  long lVar6;
  long lVar7;
  ostream *poVar8;
  byte bVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  Margin<plot::Frame<plot::BrailleCanvas_*>_> *pMVar13;
  margin_line<plot::Frame<plot::BrailleCanvas_*>_> *pmVar14;
  value_type *pvVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  byte bVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  Size char_sz;
  Point to;
  TerminalInfo term;
  BrailleCanvas canvas;
  TerminalInfo local_c18;
  ulong local_bf0;
  long local_be8;
  long local_be0;
  ulong local_bd8;
  ulong local_bd0;
  long local_bc8;
  ulong local_bc0;
  long local_bb8;
  long local_bb0;
  ulong local_ba8;
  ulong local_ba0;
  BrailleCanvas local_b98;
  long local_b28;
  ulong local_b20;
  ulong local_b18;
  Margin<plot::Frame<plot::BrailleCanvas_*>_> local_b10;
  value_type local_a28;
  Margin<plot::Frame<plot::BrailleCanvas_*>_> local_9b8;
  value_type local_8c8;
  undefined1 local_858 [56];
  const_iterator local_820;
  Frame<plot::BrailleCanvas_*> *local_818;
  ptrdiff_t local_810;
  BrailleCanvas *local_808;
  const_iterator local_800;
  BrailleCanvas *local_7f8;
  const_iterator local_7f0;
  char *local_7e8;
  undefined8 local_7e0;
  char *local_7d8;
  undefined8 local_7d0;
  char *local_7c8;
  undefined8 local_7c0;
  char *local_7b8;
  undefined8 local_7b0;
  char *local_7a8;
  BrailleCanvas *local_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined1 local_770 [56];
  const_iterator local_738;
  Frame<plot::BrailleCanvas_*> *local_730;
  ptrdiff_t local_728;
  BrailleCanvas *local_720;
  const_iterator local_718;
  BrailleCanvas *local_710;
  const_iterator local_708;
  char *local_700;
  undefined8 local_6f8;
  char *local_6f0;
  undefined8 local_6e8;
  char *local_6e0;
  undefined8 local_6d8;
  char *local_6d0;
  undefined8 local_6c8;
  char *local_6c0;
  BrailleCanvas *local_6b8;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined1 local_688 [56];
  const_iterator local_650;
  Frame<plot::BrailleCanvas_*> *local_648;
  ptrdiff_t local_640;
  BrailleCanvas *local_638;
  const_iterator local_630;
  BrailleCanvas *local_628;
  const_iterator local_620;
  char *local_618;
  undefined8 local_610;
  char *local_608;
  undefined8 local_600;
  char *local_5f8;
  undefined8 local_5f0;
  char *local_5e8;
  undefined8 local_5e0;
  char *local_5d8;
  BrailleCanvas *local_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined1 local_5a0 [56];
  const_iterator local_568;
  Frame<plot::BrailleCanvas_*> *local_560;
  ptrdiff_t local_558;
  BrailleCanvas *local_550;
  const_iterator local_548;
  BrailleCanvas *local_540;
  const_iterator local_538;
  char *local_530;
  undefined8 local_528;
  char *local_520;
  undefined8 local_518;
  char *local_510;
  undefined8 local_508;
  char *local_500;
  undefined8 local_4f8;
  char *local_4f0;
  BrailleCanvas *local_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined1 local_4b8 [56];
  const_iterator local_480;
  Frame<plot::BrailleCanvas_*> *local_478;
  ptrdiff_t local_470;
  BrailleCanvas *local_468;
  const_iterator local_460;
  BrailleCanvas *local_458;
  const_iterator local_450;
  char *local_448;
  undefined8 local_440;
  char *local_438;
  undefined8 local_430;
  char *local_428;
  undefined8 local_420;
  char *local_418;
  undefined8 local_410;
  char *local_408;
  BrailleCanvas *local_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined1 local_3d0 [56];
  const_iterator local_398;
  Frame<plot::BrailleCanvas_*> *local_390;
  ptrdiff_t local_388;
  BrailleCanvas *local_380;
  const_iterator local_378;
  BrailleCanvas *local_370;
  const_iterator local_368;
  char *local_360;
  undefined8 local_358;
  char *local_350;
  undefined8 local_348;
  char *local_340;
  undefined8 local_338;
  char *local_330;
  undefined8 local_328;
  char *local_320;
  BrailleCanvas *local_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined1 local_2e8 [56];
  const_iterator local_2b0;
  Frame<plot::BrailleCanvas_*> *local_2a8;
  ptrdiff_t local_2a0;
  BrailleCanvas *local_298;
  const_iterator local_290;
  BrailleCanvas *local_288;
  const_iterator local_280;
  char *local_278;
  undefined8 local_270;
  char *local_268;
  undefined8 local_260;
  char *local_258;
  undefined8 local_250;
  char *local_248;
  undefined8 local_240;
  char *local_238;
  BrailleCanvas *local_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined1 local_200 [56];
  const_iterator local_1c8;
  Frame<plot::BrailleCanvas_*> *local_1c0;
  ptrdiff_t local_1b8;
  BrailleCanvas *local_1b0;
  const_iterator local_1a8;
  BrailleCanvas *local_1a0;
  const_iterator local_198;
  char *local_190;
  undefined8 local_188;
  char *local_180;
  undefined8 local_178;
  char *local_170;
  undefined8 local_168;
  char *local_160;
  undefined8 local_158;
  char *local_150;
  BrailleCanvas *local_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined1 local_118 [56];
  const_iterator local_e0;
  Frame<plot::BrailleCanvas_*> *local_d8;
  ptrdiff_t local_d0;
  BrailleCanvas *local_c8;
  const_iterator local_c0;
  BrailleCanvas *local_b8;
  const_iterator local_b0;
  char *local_a8;
  undefined8 local_a0;
  char *local_98;
  undefined8 local_90;
  char *local_88;
  undefined8 local_80;
  char *local_78;
  undefined8 local_70;
  char *local_68;
  BrailleCanvas *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  bVar19 = 0;
  local_c18.mode = None;
  local_c18.foreground_color.r = 0.9;
  local_c18.foreground_color.g = 0.9;
  local_c18.foreground_color.b = 0.9;
  local_c18.foreground_color.a = 1.0;
  local_c18.background_color.r = 0.0;
  local_c18.background_color.g = 0.0;
  local_c18.background_color.b = 0.0;
  local_c18.background_color.a = 1.0;
  local_c18.term_ = 1;
  plot::TerminalInfo::detect<void>(&local_c18);
  term_00.term_ = local_c18.term_;
  term_00.background_color.a = local_c18.background_color.a;
  term_00.foreground_color.b = local_c18.foreground_color.b;
  term_00.foreground_color.g = local_c18.foreground_color.g;
  term_00.background_color.r = local_c18.background_color.r;
  term_00.foreground_color.a = local_c18.foreground_color.a;
  term_00.background_color.b = local_c18.background_color.b;
  term_00.background_color.g = local_c18.background_color.g;
  term_00.foreground_color.r = local_c18.foreground_color.r;
  term_00.mode = local_c18.mode;
  char_sz.y = 7;
  char_sz.x = 0x1e;
  plot::BrailleCanvas::BrailleCanvas(&local_b98,char_sz,term_00);
  local_b28 = local_b98.cols_ * 2 + -1;
  local_bf0 = local_b98.cols_ * 2;
  uVar10 = local_b98.lines_ * 4 - 2;
  local_bd0 = local_b98.lines_ * 4;
  lVar6 = -local_b28;
  if (0 < local_b28) {
    lVar6 = local_b28;
  }
  local_ba0 = -uVar10;
  if (0 < (long)uVar10) {
    local_ba0 = uVar10;
  }
  local_ba0 = local_ba0 >> 1;
  lVar7 = 0;
  if (0 < local_b28) {
    lVar7 = local_b28;
  }
  local_b18 = 0;
  if (0 < (long)uVar10) {
    local_b18 = uVar10;
  }
  local_b20 = lVar7 + 1;
  local_b18 = local_b18 | 1;
  local_bc0 = (long)local_bf0 >> 0x3f & local_bf0;
  local_bd8 = (long)local_bd0 >> 0x3f & local_bd0;
  if (SBORROW8(local_b20,local_bf0) != (long)(local_b20 + local_b98.cols_ * -2) < 0) {
    local_bf0 = local_b20;
  }
  if ((long)local_b18 < (long)local_bd0) {
    local_bd0 = local_b18;
  }
  local_be0 = (long)local_bc0 >> 1;
  local_bc8 = local_bf0 - (long)local_bf0 / 2;
  if (local_bc8 < 2) {
    local_bc8 = 1;
  }
  uVar10 = local_bd0 + 3;
  if (-1 < (long)local_bd0) {
    uVar10 = local_bd0;
  }
  local_be8 = (((long)uVar10 >> 2) + 1) - (ulong)((local_bd0 & 3) == 0);
  if (local_be8 < 2) {
    local_be8 = 1;
  }
  fVar20 = (float)local_ba0;
  fVar21 = (float)(lVar6 + 1);
  local_bb8 = (long)local_bd8 >> 2;
  do {
    local_ba8 = local_bb8 * 4;
    if (local_ba8 - local_bd8 == 0 || (long)local_ba8 < (long)local_bd8) {
      local_ba8 = local_bd8;
    }
    if ((long)local_bd0 <= (long)local_ba8) {
      local_ba8 = local_bd0;
    }
    uVar10 = local_bb8 * 4 + 4;
    if ((long)uVar10 <= (long)local_bd8) {
      uVar10 = local_bd8;
    }
    local_bb0 = local_be0;
    if ((long)local_bd0 <= (long)uVar10) {
      uVar10 = local_bd0;
    }
    do {
      uVar17 = local_bb0 * 2;
      if (local_bb0 * 2 <= (long)local_bc0) {
        uVar17 = local_bc0;
      }
      uVar18 = local_bb0 * 2 + 2;
      if ((long)uVar18 <= (long)local_bc0) {
        uVar18 = local_bc0;
      }
      if ((long)local_bf0 <= (long)uVar18) {
        uVar18 = local_bf0;
      }
      local_b10.top_ = 0x3e4ccccd3e4ccccd;
      local_b10.right_ = 0x3f8000003f800000;
      local_b10.bottom_ = local_b10.bottom_ & 0xffffffffffffff00;
      if ((long)uVar17 < (long)uVar18) {
        if ((long)local_bf0 <= (long)uVar17) {
          uVar17 = local_bf0;
        }
        do {
          fVar22 = sinf(((float)(long)uVar17 * 12.566368) / fVar21);
          lVar6 = lroundf(fVar22 * fVar20);
          uVar12 = local_ba0;
          uVar16 = local_ba0 - lVar6;
          fVar22 = sinf((((float)(long)uVar17 + 1.0) * 12.566368) / fVar21);
          lVar7 = lroundf(fVar22 * fVar20);
          uVar12 = uVar12 - lVar7;
          if (lVar7 == lVar6) {
            uVar12 = uVar16 + 1;
          }
          uVar11 = uVar12 + 1;
          if ((long)uVar12 < (long)uVar16) {
            uVar12 = uVar16 + 1;
            uVar16 = uVar11;
          }
          if ((long)uVar16 <= (long)local_ba8) {
            uVar16 = local_ba8;
          }
          if ((long)uVar10 <= (long)uVar12) {
            uVar12 = uVar10;
          }
          if ((long)uVar16 < (long)uVar12) {
            bVar9 = (byte)local_b10.bottom_;
            do {
              bVar9 = bVar9 | *(byte *)((long)&plot::detail::braille::pixel_codes +
                                       (ulong)((uint)uVar16 & 3) + (ulong)((uint)uVar17 & 1) * 4);
              uVar16 = uVar16 + 1;
            } while ((long)uVar16 < (long)uVar12);
            local_b10.bottom_ = CONCAT71(local_b10.bottom_._1_7_,bVar9);
          }
          uVar17 = uVar17 + 1;
        } while ((long)uVar17 < (long)uVar18);
      }
      lVar7 = local_bb0;
      lVar6 = local_bb8;
      pbVar1 = local_b98.blocks_.
               super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
               .
               super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
               ._M_impl.super__Vector_impl_data._M_start + local_b98.cols_ * local_bb8 + local_bb0;
      if ((byte)local_b10.bottom_ == '\0') {
        local_9b8.bottom_ = CONCAT44(local_9b8.bottom_._4_4_,*(undefined4 *)&pbVar1->pixels);
        local_9b8.top_._0_4_ = (pbVar1->color).r;
        local_9b8.top_._4_4_ = (pbVar1->color).g;
        local_9b8.right_._0_4_ = (pbVar1->color).b;
        local_9b8.right_._4_4_ = (pbVar1->color).a;
      }
      else {
        plot::detail::braille::block_t::over((block_t *)&local_9b8,(block_t *)&local_b10,pbVar1);
      }
      pbVar1->pixels = (uint8_t)local_9b8.bottom_;
      (pbVar1->color).r = (float)(undefined4)local_9b8.top_;
      (pbVar1->color).g = (float)local_9b8.top_._4_4_;
      (pbVar1->color).b = (float)(undefined4)local_9b8.right_;
      (pbVar1->color).a = (float)local_9b8.right_._4_4_;
      local_bb0 = lVar7 + 1;
    } while (lVar7 + 1 != local_bc8);
    local_bb8 = lVar6 + 1;
  } while (local_bb8 != local_be8);
  local_bf0 = local_b98.cols_ * 2;
  local_bd0 = local_b98.lines_ * 4;
  local_bc0 = (long)local_bf0 >> 0x3f & local_bf0;
  local_bd8 = (long)local_bd0 >> 0x3f & local_bd0;
  if (SBORROW8(local_b20,local_bf0) != (long)(local_b20 + local_b98.cols_ * -2) < 0) {
    local_bf0 = local_b20;
  }
  if ((long)local_b18 < (long)local_bd0) {
    local_bd0 = local_b18;
  }
  local_be0 = (long)local_bc0 >> 1;
  local_bc8 = local_bf0 - (long)local_bf0 / 2;
  if (local_bc8 < 2) {
    local_bc8 = 1;
  }
  uVar10 = local_bd0 + 3;
  if (-1 < (long)local_bd0) {
    uVar10 = local_bd0;
  }
  local_be8 = (((long)uVar10 >> 2) + 1) - (ulong)((local_bd0 & 3) == 0);
  if (local_be8 < 2) {
    local_be8 = 1;
  }
  lVar6 = (long)local_bd8 >> 2;
  do {
    local_ba8 = lVar6 * 4;
    if (local_ba8 - local_bd8 == 0 || (long)local_ba8 < (long)local_bd8) {
      local_ba8 = local_bd8;
    }
    if ((long)local_bd0 <= (long)local_ba8) {
      local_ba8 = local_bd0;
    }
    uVar10 = lVar6 * 4 + 4;
    if ((long)uVar10 <= (long)local_bd8) {
      uVar10 = local_bd8;
    }
    lVar7 = local_be0;
    local_bb8 = lVar6;
    if ((long)local_bd0 <= (long)uVar10) {
      uVar10 = local_bd0;
    }
    do {
      uVar17 = lVar7 * 2;
      if (lVar7 * 2 <= (long)local_bc0) {
        uVar17 = local_bc0;
      }
      uVar18 = lVar7 * 2 + 2;
      if ((long)uVar18 <= (long)local_bc0) {
        uVar18 = local_bc0;
      }
      if ((long)local_bf0 <= (long)uVar18) {
        uVar18 = local_bf0;
      }
      local_b10.top_ = 0x3ecccccd3f800000;
      local_b10.right_ = 0x3f8000003ecccccd;
      local_b10.bottom_ = local_b10.bottom_ & 0xffffffffffffff00;
      local_bb0 = lVar7;
      if ((long)uVar17 < (long)uVar18) {
        if ((long)local_bf0 <= (long)uVar17) {
          uVar17 = local_bf0;
        }
        do {
          fVar22 = cosf(((float)(long)uVar17 * 12.566368) / fVar21);
          lVar6 = lroundf(fVar22 * fVar20);
          uVar12 = local_ba0;
          uVar16 = local_ba0 - lVar6;
          fVar22 = cosf((((float)(long)uVar17 + 1.0) * 12.566368) / fVar21);
          lVar7 = lroundf(fVar22 * fVar20);
          uVar12 = uVar12 - lVar7;
          if (lVar7 == lVar6) {
            uVar12 = uVar16 + 1;
          }
          uVar11 = uVar12 + 1;
          if ((long)uVar12 < (long)uVar16) {
            uVar12 = uVar16 + 1;
            uVar16 = uVar11;
          }
          if ((long)uVar16 <= (long)local_ba8) {
            uVar16 = local_ba8;
          }
          if ((long)uVar10 <= (long)uVar12) {
            uVar12 = uVar10;
          }
          if ((long)uVar16 < (long)uVar12) {
            uVar11 = local_b10.bottom_ & 0xff;
            do {
              bVar9 = (byte)uVar11 |
                      *(byte *)((long)&plot::detail::braille::pixel_codes +
                               (ulong)((uint)uVar16 & 3) + (ulong)((uint)uVar17 & 1) * 4);
              uVar11 = (ulong)bVar9;
              uVar16 = uVar16 + 1;
            } while ((long)uVar16 < (long)uVar12);
            local_b10.bottom_ = CONCAT71(local_b10.bottom_._1_7_,bVar9);
          }
          uVar17 = uVar17 + 1;
        } while ((long)uVar17 < (long)uVar18);
      }
      lVar3 = local_bb0;
      lVar6 = local_bb8;
      pbVar1 = local_b98.blocks_.
               super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
               .
               super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
               ._M_impl.super__Vector_impl_data._M_start + local_b98.cols_ * local_bb8 + local_bb0;
      if ((byte)local_b10.bottom_ == '\0') {
        local_9b8.bottom_ = CONCAT44(local_9b8.bottom_._4_4_,*(undefined4 *)&pbVar1->pixels);
        local_9b8.top_._0_4_ = (pbVar1->color).r;
        local_9b8.top_._4_4_ = (pbVar1->color).g;
        local_9b8.right_._0_4_ = (pbVar1->color).b;
        local_9b8.right_._4_4_ = (pbVar1->color).a;
      }
      else {
        plot::detail::braille::block_t::over((block_t *)&local_9b8,(block_t *)&local_b10,pbVar1);
      }
      pbVar1->pixels = (uint8_t)local_9b8.bottom_;
      (pbVar1->color).r = (float)(undefined4)local_9b8.top_;
      (pbVar1->color).g = (float)local_9b8.top_._4_4_;
      (pbVar1->color).b = (float)(undefined4)local_9b8.right_;
      (pbVar1->color).a = (float)local_9b8.right_._4_4_;
      lVar7 = lVar3 + 1;
    } while (lVar3 + 1 != local_bc8);
    lVar6 = lVar6 + 1;
  } while (lVar6 != local_be8);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_ba0;
  to.y = local_ba0;
  to.x = local_b28;
  plot::BrailleCanvas::line
            (&local_b98,&local_c18.foreground_color,(Point)(auVar2 << 0x40),to,ClipSrc);
  pbVar4 = local_b98.blocks_.
           super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
           .
           super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_9b8.block_.term_.term_ = local_c18.term_;
  local_9b8.block_.term_.background_color.a = local_c18.background_color.a;
  local_118._16_8_ = &local_9b8.block_;
  local_9b8.block_.term_.foreground_color.r = local_c18.foreground_color.r;
  local_9b8.block_.term_.mode = local_c18.mode;
  local_9b8.block_.term_.foreground_color.b = local_c18.foreground_color.b;
  local_9b8.block_.term_.foreground_color.g = local_c18.foreground_color.g;
  local_9b8.block_.term_.background_color.r = local_c18.background_color.r;
  local_9b8.block_.term_.foreground_color.a = local_c18.foreground_color.a;
  local_9b8.block_.term_.background_color.b = local_c18.background_color.b;
  local_9b8.block_.term_.background_color.g = local_c18.background_color.g;
  local_9b8.block_.label_._M_len = 0;
  local_9b8.block_.label_._M_str = (char *)0x0;
  local_9b8.block_.align_ = Left;
  local_9b8.block_.border_.top_left._M_len = 1;
  local_9b8.block_.border_.top_left._M_str = " ";
  local_9b8.block_.border_.top._M_len = 1;
  local_9b8.block_.border_.top._M_str = " ";
  local_9b8.block_.border_.top_right._M_len = 1;
  local_9b8.block_.border_.top_right._M_str = " ";
  local_9b8.block_.border_.left._M_len = 1;
  local_9b8.block_.border_.left._M_str = " ";
  local_9b8.block_.border_.right._M_len = 1;
  local_9b8.block_.border_.right._M_str = " ";
  local_9b8.block_.border_.bottom_left._M_len = 1;
  local_9b8.block_.border_.bottom_left._M_str = " ";
  local_9b8.block_.border_.bottom._M_len = 1;
  local_9b8.block_.border_.bottom._M_str = " ";
  local_9b8.block_.border_.bottom_right._M_len = 1;
  local_9b8.block_.border_.bottom_right._M_str = " ";
  local_9b8.top_ = 1;
  local_9b8.right_ = 2;
  local_9b8.bottom_ = 0;
  local_9b8.left_ = 2;
  local_118._0_8_ = &local_9b8;
  local_118._8_8_ = -1;
  local_118._24_8_ = -1;
  local_118._40_8_ =
       local_b98.blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0._M_current =
       local_b98.blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_d0 = 1;
  local_c0._M_current =
       local_b98.blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_b0._M_current =
       local_b98.blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_200._0_8_ = &local_b10;
  local_9b8.block_.block_ = &local_b98;
  local_118._32_8_ = &local_b98;
  local_118._48_8_ = &local_b98;
  local_d8 = (Frame<plot::BrailleCanvas_*> *)local_118._16_8_;
  local_c8 = &local_b98;
  local_b8 = &local_b98;
  do {
    poVar8 = plot::detail::operator<<((ostream *)&std::cout,(value_type *)local_118);
    local_b10.top_ = CONCAT71(local_b10.top_._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_200._0_8_,1);
    plot::detail::margin_line<plot::Frame<plot::BrailleCanvas_*>_>::next
              ((margin_line<plot::Frame<plot::BrailleCanvas_*>_> *)local_200._0_8_,
               (value_type *)local_118);
    pbVar5 = local_b98.blocks_.
             super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
             .
             super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pMVar13 = (Margin<plot::Frame<plot::BrailleCanvas_*>_> *)local_200._0_8_;
    pvVar15 = (value_type *)local_118;
    for (lVar6 = 0xe; lVar6 != 0; lVar6 = lVar6 + -1) {
      pvVar15->margin_ = (Margin<plot::Frame<plot::BrailleCanvas_*>_> *)pMVar13->top_;
      pMVar13 = (Margin<plot::Frame<plot::BrailleCanvas_*>_> *)
                ((long)pMVar13 + (ulong)bVar19 * -0x10 + 8);
      pvVar15 = (value_type *)((long)pvVar15 + (ulong)bVar19 * -0x10 + 8);
    }
  } while ((((pointer)local_118._40_8_ != pbVar4) || (local_118._24_8_ != 1)) ||
          (local_118._8_8_ != 0));
  local_b10.block_.term_.term_ = local_c18.term_;
  local_b10.block_.term_.background_color.a = local_c18.background_color.a;
  local_200._16_8_ = &local_b10.block_;
  local_b10.block_.term_.foreground_color.r = local_c18.foreground_color.r;
  local_b10.block_.term_.mode = local_c18.mode;
  local_b10.block_.term_.foreground_color.b = local_c18.foreground_color.b;
  local_b10.block_.term_.foreground_color.g = local_c18.foreground_color.g;
  local_b10.block_.term_.background_color.r = local_c18.background_color.r;
  local_b10.block_.term_.foreground_color.a = local_c18.foreground_color.a;
  local_b10.block_.term_.background_color.b = local_c18.background_color.b;
  local_b10.block_.term_.background_color.g = local_c18.background_color.g;
  local_b10.block_.label_._M_len = 5;
  local_b10.block_.label_._M_str = "Label";
  local_b10.block_.align_ = Left;
  local_b10.block_.border_.top_left._M_len = 3;
  local_b10.block_.border_.top_left._M_str = anon_var_dwarf_8c96;
  local_b10.block_.border_.top._M_len = 3;
  local_b10.block_.border_.top._M_str = anon_var_dwarf_8b74;
  local_b10.block_.border_.top_right._M_len = 3;
  local_b10.block_.border_.top_right._M_str = anon_var_dwarf_8cae;
  local_b10.block_.border_.left._M_len = 3;
  local_b10.block_.border_.left._M_str = anon_var_dwarf_8b8e;
  local_b10.block_.border_.right._M_len = 3;
  local_b10.block_.border_.right._M_str = anon_var_dwarf_8b8e;
  local_b10.block_.border_.bottom_left._M_len = 3;
  local_b10.block_.border_.bottom_left._M_str = anon_var_dwarf_8cc6;
  local_b10.block_.border_.bottom._M_len = 3;
  local_b10.block_.border_.bottom._M_str = anon_var_dwarf_8b74;
  local_b10.block_.border_.bottom_right._M_len = 3;
  local_b10.block_.border_.bottom_right._M_str = anon_var_dwarf_8cde;
  local_b10.top_ = 1;
  local_b10.right_ = 2;
  local_b10.bottom_ = 0;
  local_b10.left_ = 2;
  local_200._8_8_ = -1;
  local_200._24_8_ = -1;
  local_200._40_8_ =
       local_b98.blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1c8._M_current =
       local_b98.blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_1b8 = 1;
  local_1a8._M_current =
       local_b98.blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_198._M_current =
       local_b98.blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_b10.block_.block_ = &local_b98;
  local_200._32_8_ = &local_b98;
  local_200._48_8_ = &local_b98;
  local_1c0 = (Frame<plot::BrailleCanvas_*> *)local_200._16_8_;
  local_1b0 = &local_b98;
  local_1a0 = &local_b98;
  do {
    poVar8 = plot::detail::operator<<((ostream *)&std::cout,(value_type *)local_200);
    local_118[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_118,1);
    plot::detail::margin_line<plot::Frame<plot::BrailleCanvas_*>_>::next
              ((margin_line<plot::Frame<plot::BrailleCanvas_*>_> *)local_118,(value_type *)local_200
              );
    pbVar4 = local_b98.blocks_.
             super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
             .
             super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pMVar13 = (Margin<plot::Frame<plot::BrailleCanvas_*>_> *)local_118;
    pvVar15 = (value_type *)local_200;
    for (lVar6 = 0xe; lVar6 != 0; lVar6 = lVar6 + -1) {
      pvVar15->margin_ = (Margin<plot::Frame<plot::BrailleCanvas_*>_> *)pMVar13->top_;
      pMVar13 = (Margin<plot::Frame<plot::BrailleCanvas_*>_> *)
                ((long)pMVar13 + (ulong)bVar19 * -0x10 + 8);
      pvVar15 = (value_type *)((long)pvVar15 + (ulong)bVar19 * -0x10 + 8);
    }
  } while ((((pointer)local_200._40_8_ != pbVar5) || (local_200._24_8_ != 1)) ||
          (local_200._8_8_ != 0));
  local_38 = CONCAT44(local_c18.term_,local_c18.background_color.a);
  local_2e8._16_8_ = local_118 + 0x20;
  local_58 = CONCAT44(local_c18.foreground_color.r,local_c18.mode);
  uStack_50 = CONCAT44(local_c18.foreground_color.b,local_c18.foreground_color.g);
  local_48 = CONCAT44(local_c18.background_color.r,local_c18.foreground_color.a);
  uStack_40 = CONCAT44(local_c18.background_color.b,local_c18.background_color.g);
  local_118._32_8_ = (BrailleCanvas *)0x5;
  local_118._40_8_ = "Label";
  local_118._48_4_ = 1;
  local_e0._M_current = (block_t *)0x3;
  local_d8 = (Frame<plot::BrailleCanvas_*> *)anon_var_dwarf_8c8a;
  local_d0 = 3;
  local_c8 = (BrailleCanvas *)anon_var_dwarf_8b74;
  local_c0._M_current = (block_t *)0x3;
  local_b8 = (BrailleCanvas *)anon_var_dwarf_8ca2;
  local_b0._M_current = (block_t *)0x3;
  local_a8 = anon_var_dwarf_8b8e;
  local_a0 = 3;
  local_98 = anon_var_dwarf_8b8e;
  local_90 = 3;
  local_88 = anon_var_dwarf_8cba;
  local_80 = 3;
  local_78 = anon_var_dwarf_8b74;
  local_70 = 3;
  local_68 = anon_var_dwarf_8cd2;
  local_118._0_8_ = (Margin<plot::Frame<plot::BrailleCanvas_*>_> *)0x1;
  local_118._8_8_ = 2;
  local_118._16_8_ = (Frame<plot::BrailleCanvas_*> *)0x0;
  local_118._24_8_ = 2;
  local_2e8._8_8_ = -1;
  local_2e8._24_8_ = -1;
  local_2e8._40_8_ =
       local_b98.blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_2b0._M_current =
       local_b98.blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_2a0 = 1;
  local_290._M_current =
       local_b98.blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_280._M_current =
       local_b98.blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_2e8._0_8_ = (Margin<plot::Frame<plot::BrailleCanvas_*>_> *)local_118;
  local_2e8._32_8_ = &local_b98;
  local_2e8._48_8_ = &local_b98;
  local_2a8 = (Frame<plot::BrailleCanvas_*> *)local_2e8._16_8_;
  local_298 = &local_b98;
  local_288 = &local_b98;
  local_60 = &local_b98;
  do {
    poVar8 = plot::detail::operator<<((ostream *)&std::cout,(value_type *)local_2e8);
    local_200[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_200,1);
    plot::detail::margin_line<plot::Frame<plot::BrailleCanvas_*>_>::next
              ((margin_line<plot::Frame<plot::BrailleCanvas_*>_> *)local_200,(value_type *)local_2e8
              );
    pbVar5 = local_b98.blocks_.
             super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
             .
             super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pMVar13 = (Margin<plot::Frame<plot::BrailleCanvas_*>_> *)local_200;
    pvVar15 = (value_type *)local_2e8;
    for (lVar6 = 0xe; lVar6 != 0; lVar6 = lVar6 + -1) {
      pvVar15->margin_ = (Margin<plot::Frame<plot::BrailleCanvas_*>_> *)pMVar13->top_;
      pMVar13 = (Margin<plot::Frame<plot::BrailleCanvas_*>_> *)
                ((long)pMVar13 + (ulong)bVar19 * -0x10 + 8);
      pvVar15 = (value_type *)((long)pvVar15 + (ulong)bVar19 * -0x10 + 8);
    }
  } while ((((pointer)local_2e8._40_8_ != pbVar4) || (local_2e8._24_8_ != 1)) ||
          (local_2e8._8_8_ != 0));
  local_120 = CONCAT44(local_c18.term_,local_c18.background_color.a);
  local_3d0._16_8_ = local_200 + 0x20;
  local_140 = CONCAT44(local_c18.foreground_color.r,local_c18.mode);
  uStack_138 = CONCAT44(local_c18.foreground_color.b,local_c18.foreground_color.g);
  local_130 = CONCAT44(local_c18.background_color.r,local_c18.foreground_color.a);
  uStack_128 = CONCAT44(local_c18.background_color.b,local_c18.background_color.g);
  local_200._32_8_ = (BrailleCanvas *)0x5;
  local_200._40_8_ = "Label";
  local_200._48_4_ = 2;
  local_1c8._M_current = (block_t *)0x3;
  local_1c0 = (Frame<plot::BrailleCanvas_*> *)anon_var_dwarf_8cea;
  local_1b8 = 3;
  local_1b0 = (BrailleCanvas *)anon_var_dwarf_8b9a;
  local_1a8._M_current = (block_t *)0x3;
  local_1a0 = (BrailleCanvas *)anon_var_dwarf_8cf6;
  local_198._M_current = (block_t *)0x3;
  local_190 = anon_var_dwarf_8ba6;
  local_188 = 3;
  local_180 = anon_var_dwarf_8ba6;
  local_178 = 3;
  local_170 = anon_var_dwarf_8d02;
  local_168 = 3;
  local_160 = anon_var_dwarf_8b9a;
  local_158 = 3;
  local_150 = anon_var_dwarf_8d0e;
  local_200._0_8_ = (Margin<plot::Frame<plot::BrailleCanvas_*>_> *)0x1;
  local_200._8_8_ = 2;
  local_200._16_8_ = (Frame<plot::BrailleCanvas_*> *)0x0;
  local_200._24_8_ = 2;
  local_3d0._8_8_ = -1;
  local_3d0._24_8_ = -1;
  local_3d0._40_8_ =
       local_b98.blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_398._M_current =
       local_b98.blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_388 = 1;
  local_378._M_current =
       local_b98.blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_368._M_current =
       local_b98.blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_3d0._0_8_ = (Margin<plot::Frame<plot::BrailleCanvas_*>_> *)local_200;
  local_3d0._32_8_ = &local_b98;
  local_3d0._48_8_ = &local_b98;
  local_390 = (Frame<plot::BrailleCanvas_*> *)local_3d0._16_8_;
  local_380 = &local_b98;
  local_370 = &local_b98;
  local_148 = &local_b98;
  do {
    poVar8 = plot::detail::operator<<((ostream *)&std::cout,(value_type *)local_3d0);
    local_2e8[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_2e8,1);
    plot::detail::margin_line<plot::Frame<plot::BrailleCanvas_*>_>::next
              ((margin_line<plot::Frame<plot::BrailleCanvas_*>_> *)local_2e8,(value_type *)local_3d0
              );
    pbVar4 = local_b98.blocks_.
             super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
             .
             super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pMVar13 = (Margin<plot::Frame<plot::BrailleCanvas_*>_> *)local_2e8;
    pvVar15 = (value_type *)local_3d0;
    for (lVar6 = 0xe; lVar6 != 0; lVar6 = lVar6 + -1) {
      pvVar15->margin_ = (Margin<plot::Frame<plot::BrailleCanvas_*>_> *)pMVar13->top_;
      pMVar13 = (Margin<plot::Frame<plot::BrailleCanvas_*>_> *)
                ((long)pMVar13 + (ulong)bVar19 * -0x10 + 8);
      pvVar15 = (value_type *)((long)pvVar15 + (ulong)bVar19 * -0x10 + 8);
    }
  } while ((((pointer)local_3d0._40_8_ != pbVar5) || (local_3d0._24_8_ != 1)) ||
          (local_3d0._8_8_ != 0));
  local_208 = CONCAT44(local_c18.term_,local_c18.background_color.a);
  local_4b8._16_8_ = local_2e8 + 0x20;
  local_228 = CONCAT44(local_c18.foreground_color.r,local_c18.mode);
  uStack_220 = CONCAT44(local_c18.foreground_color.b,local_c18.foreground_color.g);
  local_218 = CONCAT44(local_c18.background_color.r,local_c18.foreground_color.a);
  uStack_210 = CONCAT44(local_c18.background_color.b,local_c18.background_color.g);
  local_2e8._32_8_ = (BrailleCanvas *)0x0;
  local_2e8._40_8_ = (block_t *)0x0;
  local_2e8._48_8_ = local_2e8._48_8_ & 0xffffffff00000000;
  local_2b0._M_current = (block_t *)0x3;
  local_2a8 = (Frame<plot::BrailleCanvas_*> *)anon_var_dwarf_8c96;
  local_2a0 = 3;
  local_298 = (BrailleCanvas *)anon_var_dwarf_8bb2;
  local_290._M_current = (block_t *)0x3;
  local_288 = (BrailleCanvas *)anon_var_dwarf_8cae;
  local_280._M_current = (block_t *)0x3;
  local_278 = anon_var_dwarf_8bca;
  local_270 = 3;
  local_268 = anon_var_dwarf_8bd6;
  local_260 = 3;
  local_258 = anon_var_dwarf_8cc6;
  local_250 = 3;
  local_248 = anon_var_dwarf_8bbe;
  local_240 = 3;
  local_238 = anon_var_dwarf_8cde;
  local_2e8._0_8_ = (Margin<plot::Frame<plot::BrailleCanvas_*>_> *)0x1;
  local_2e8._8_8_ = 2;
  local_2e8._16_8_ = (Frame<plot::BrailleCanvas_*> *)0x0;
  local_2e8._24_8_ = 2;
  local_4b8._8_8_ = -1;
  local_4b8._24_8_ = -1;
  local_4b8._40_8_ =
       local_b98.blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_480._M_current =
       local_b98.blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_470 = 1;
  local_460._M_current =
       local_b98.blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_450._M_current =
       local_b98.blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_4b8._0_8_ = (Margin<plot::Frame<plot::BrailleCanvas_*>_> *)local_2e8;
  local_4b8._32_8_ = &local_b98;
  local_4b8._48_8_ = &local_b98;
  local_478 = (Frame<plot::BrailleCanvas_*> *)local_4b8._16_8_;
  local_468 = &local_b98;
  local_458 = &local_b98;
  local_230 = &local_b98;
  do {
    poVar8 = plot::detail::operator<<((ostream *)&std::cout,(value_type *)local_4b8);
    local_3d0[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_3d0,1);
    plot::detail::margin_line<plot::Frame<plot::BrailleCanvas_*>_>::next
              ((margin_line<plot::Frame<plot::BrailleCanvas_*>_> *)local_3d0,(value_type *)local_4b8
              );
    pbVar5 = local_b98.blocks_.
             super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
             .
             super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pMVar13 = (Margin<plot::Frame<plot::BrailleCanvas_*>_> *)local_3d0;
    pvVar15 = (value_type *)local_4b8;
    for (lVar6 = 0xe; lVar6 != 0; lVar6 = lVar6 + -1) {
      pvVar15->margin_ = (Margin<plot::Frame<plot::BrailleCanvas_*>_> *)pMVar13->top_;
      pMVar13 = (Margin<plot::Frame<plot::BrailleCanvas_*>_> *)
                ((long)pMVar13 + (ulong)bVar19 * -0x10 + 8);
      pvVar15 = (value_type *)((long)pvVar15 + (ulong)bVar19 * -0x10 + 8);
    }
  } while ((((pointer)local_4b8._40_8_ != pbVar4) || (local_4b8._24_8_ != 1)) ||
          (local_4b8._8_8_ != 0));
  local_2f0 = CONCAT44(local_c18.term_,local_c18.background_color.a);
  local_5a0._16_8_ = local_3d0 + 0x20;
  local_310 = CONCAT44(local_c18.foreground_color.r,local_c18.mode);
  uStack_308 = CONCAT44(local_c18.foreground_color.b,local_c18.foreground_color.g);
  local_300 = CONCAT44(local_c18.background_color.r,local_c18.foreground_color.a);
  uStack_2f8 = CONCAT44(local_c18.background_color.b,local_c18.background_color.g);
  local_3d0._32_8_ = (BrailleCanvas *)0x0;
  local_3d0._40_8_ = (block_t *)0x0;
  local_3d0._48_8_ = local_3d0._48_8_ & 0xffffffff00000000;
  local_398._M_current = (block_t *)0x3;
  local_390 = (Frame<plot::BrailleCanvas_*> *)anon_var_dwarf_8c8a;
  local_388 = 3;
  local_380 = (BrailleCanvas *)anon_var_dwarf_8bb2;
  local_378._M_current = (block_t *)0x3;
  local_370 = (BrailleCanvas *)anon_var_dwarf_8ca2;
  local_368._M_current = (block_t *)0x3;
  local_360 = anon_var_dwarf_8bca;
  local_358 = 3;
  local_350 = anon_var_dwarf_8bd6;
  local_348 = 3;
  local_340 = anon_var_dwarf_8cba;
  local_338 = 3;
  local_330 = anon_var_dwarf_8bbe;
  local_328 = 3;
  local_320 = anon_var_dwarf_8cd2;
  local_3d0._0_8_ = (Margin<plot::Frame<plot::BrailleCanvas_*>_> *)0x1;
  local_3d0._8_8_ = 2;
  local_3d0._16_8_ = (Frame<plot::BrailleCanvas_*> *)0x0;
  local_3d0._24_8_ = 2;
  local_5a0._8_8_ = -1;
  local_5a0._24_8_ = -1;
  local_5a0._40_8_ =
       local_b98.blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_568._M_current =
       local_b98.blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_558 = 1;
  local_548._M_current =
       local_b98.blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_538._M_current =
       local_b98.blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_5a0._0_8_ = (Margin<plot::Frame<plot::BrailleCanvas_*>_> *)local_3d0;
  local_5a0._32_8_ = &local_b98;
  local_5a0._48_8_ = &local_b98;
  local_560 = (Frame<plot::BrailleCanvas_*> *)local_5a0._16_8_;
  local_550 = &local_b98;
  local_540 = &local_b98;
  local_318 = &local_b98;
  do {
    poVar8 = plot::detail::operator<<((ostream *)&std::cout,(value_type *)local_5a0);
    local_4b8[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_4b8,1);
    plot::detail::margin_line<plot::Frame<plot::BrailleCanvas_*>_>::next
              ((margin_line<plot::Frame<plot::BrailleCanvas_*>_> *)local_4b8,(value_type *)local_5a0
              );
    pbVar4 = local_b98.blocks_.
             super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
             .
             super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pMVar13 = (Margin<plot::Frame<plot::BrailleCanvas_*>_> *)local_4b8;
    pvVar15 = (value_type *)local_5a0;
    for (lVar6 = 0xe; lVar6 != 0; lVar6 = lVar6 + -1) {
      pvVar15->margin_ = (Margin<plot::Frame<plot::BrailleCanvas_*>_> *)pMVar13->top_;
      pMVar13 = (Margin<plot::Frame<plot::BrailleCanvas_*>_> *)
                ((long)pMVar13 + (ulong)bVar19 * -0x10 + 8);
      pvVar15 = (value_type *)((long)pvVar15 + (ulong)bVar19 * -0x10 + 8);
    }
  } while ((((pointer)local_5a0._40_8_ != pbVar5) || (local_5a0._24_8_ != 1)) ||
          (local_5a0._8_8_ != 0));
  local_3d8 = CONCAT44(local_c18.term_,local_c18.background_color.a);
  local_688._16_8_ = local_4b8 + 0x20;
  local_3f8 = CONCAT44(local_c18.foreground_color.r,local_c18.mode);
  uStack_3f0 = CONCAT44(local_c18.foreground_color.b,local_c18.foreground_color.g);
  local_3e8 = CONCAT44(local_c18.background_color.r,local_c18.foreground_color.a);
  uStack_3e0 = CONCAT44(local_c18.background_color.b,local_c18.background_color.g);
  local_4b8._32_8_ = (BrailleCanvas *)0x0;
  local_4b8._40_8_ = (block_t *)0x0;
  local_4b8._48_8_ = local_4b8._48_8_ & 0xffffffff00000000;
  local_480._M_current = (block_t *)0x3;
  local_478 = (Frame<plot::BrailleCanvas_*> *)anon_var_dwarf_8cea;
  local_470 = 3;
  local_468 = (BrailleCanvas *)anon_var_dwarf_8be2;
  local_460._M_current = (block_t *)0x3;
  local_458 = (BrailleCanvas *)anon_var_dwarf_8cf6;
  local_450._M_current = (block_t *)0x3;
  local_448 = anon_var_dwarf_8bfa;
  local_440 = 3;
  local_438 = anon_var_dwarf_8c06;
  local_430 = 3;
  local_428 = anon_var_dwarf_8d02;
  local_420 = 3;
  local_418 = anon_var_dwarf_8bee;
  local_410 = 3;
  local_408 = anon_var_dwarf_8d0e;
  local_4b8._0_8_ = (Margin<plot::Frame<plot::BrailleCanvas_*>_> *)0x1;
  local_4b8._8_8_ = 2;
  local_4b8._16_8_ = (Frame<plot::BrailleCanvas_*> *)0x0;
  local_4b8._24_8_ = 2;
  local_688._8_8_ = -1;
  local_688._24_8_ = -1;
  local_688._40_8_ =
       local_b98.blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_650._M_current =
       local_b98.blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_640 = 1;
  local_630._M_current =
       local_b98.blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_620._M_current =
       local_b98.blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_688._0_8_ = (Margin<plot::Frame<plot::BrailleCanvas_*>_> *)local_4b8;
  local_688._32_8_ = &local_b98;
  local_688._48_8_ = &local_b98;
  local_648 = (Frame<plot::BrailleCanvas_*> *)local_688._16_8_;
  local_638 = &local_b98;
  local_628 = &local_b98;
  local_400 = &local_b98;
  do {
    poVar8 = plot::detail::operator<<((ostream *)&std::cout,(value_type *)local_688);
    local_5a0[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_5a0,1);
    plot::detail::margin_line<plot::Frame<plot::BrailleCanvas_*>_>::next
              ((margin_line<plot::Frame<plot::BrailleCanvas_*>_> *)local_5a0,(value_type *)local_688
              );
    pbVar5 = local_b98.blocks_.
             super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
             .
             super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pMVar13 = (Margin<plot::Frame<plot::BrailleCanvas_*>_> *)local_5a0;
    pvVar15 = (value_type *)local_688;
    for (lVar6 = 0xe; lVar6 != 0; lVar6 = lVar6 + -1) {
      pvVar15->margin_ = (Margin<plot::Frame<plot::BrailleCanvas_*>_> *)pMVar13->top_;
      pMVar13 = (Margin<plot::Frame<plot::BrailleCanvas_*>_> *)
                ((long)pMVar13 + (ulong)bVar19 * -0x10 + 8);
      pvVar15 = (value_type *)((long)pvVar15 + (ulong)bVar19 * -0x10 + 8);
    }
  } while ((((pointer)local_688._40_8_ != pbVar4) || (local_688._24_8_ != 1)) ||
          (local_688._8_8_ != 0));
  local_4c0 = CONCAT44(local_c18.term_,local_c18.background_color.a);
  local_770._16_8_ = local_5a0 + 0x20;
  local_4e0 = CONCAT44(local_c18.foreground_color.r,local_c18.mode);
  uStack_4d8 = CONCAT44(local_c18.foreground_color.b,local_c18.foreground_color.g);
  local_4d0 = CONCAT44(local_c18.background_color.r,local_c18.foreground_color.a);
  uStack_4c8 = CONCAT44(local_c18.background_color.b,local_c18.background_color.g);
  local_5a0._32_8_ = (BrailleCanvas *)0x0;
  local_5a0._40_8_ = (block_t *)0x0;
  local_5a0._48_8_ = local_5a0._48_8_ & 0xffffffff00000000;
  local_568._M_current = (block_t *)0x3;
  local_560 = (Frame<plot::BrailleCanvas_*> *)anon_var_dwarf_8c96;
  local_558 = 3;
  local_550 = (BrailleCanvas *)anon_var_dwarf_8c12;
  local_548._M_current = (block_t *)0x3;
  local_540 = (BrailleCanvas *)anon_var_dwarf_8cae;
  local_538._M_current = (block_t *)0x3;
  local_530 = anon_var_dwarf_8c1e;
  local_528 = 3;
  local_520 = anon_var_dwarf_8c1e;
  local_518 = 3;
  local_510 = anon_var_dwarf_8cc6;
  local_508 = 3;
  local_500 = anon_var_dwarf_8c12;
  local_4f8 = 3;
  local_4f0 = anon_var_dwarf_8cde;
  local_5a0._0_8_ = (Margin<plot::Frame<plot::BrailleCanvas_*>_> *)0x1;
  local_5a0._8_8_ = 2;
  local_5a0._16_8_ = (Frame<plot::BrailleCanvas_*> *)0x0;
  local_5a0._24_8_ = 2;
  local_770._8_8_ = -1;
  local_770._24_8_ = -1;
  local_770._40_8_ =
       local_b98.blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_738._M_current =
       local_b98.blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_728 = 1;
  local_718._M_current =
       local_b98.blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_708._M_current =
       local_b98.blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_770._0_8_ = (Margin<plot::Frame<plot::BrailleCanvas_*>_> *)local_5a0;
  local_770._32_8_ = &local_b98;
  local_770._48_8_ = &local_b98;
  local_730 = (Frame<plot::BrailleCanvas_*> *)local_770._16_8_;
  local_720 = &local_b98;
  local_710 = &local_b98;
  local_4e8 = &local_b98;
  do {
    poVar8 = plot::detail::operator<<((ostream *)&std::cout,(value_type *)local_770);
    local_688[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_688,1);
    plot::detail::margin_line<plot::Frame<plot::BrailleCanvas_*>_>::next
              ((margin_line<plot::Frame<plot::BrailleCanvas_*>_> *)local_688,(value_type *)local_770
              );
    pbVar4 = local_b98.blocks_.
             super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
             .
             super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pMVar13 = (Margin<plot::Frame<plot::BrailleCanvas_*>_> *)local_688;
    pvVar15 = (value_type *)local_770;
    for (lVar6 = 0xe; lVar6 != 0; lVar6 = lVar6 + -1) {
      pvVar15->margin_ = (Margin<plot::Frame<plot::BrailleCanvas_*>_> *)pMVar13->top_;
      pMVar13 = (Margin<plot::Frame<plot::BrailleCanvas_*>_> *)
                ((long)pMVar13 + (ulong)bVar19 * -0x10 + 8);
      pvVar15 = (value_type *)((long)pvVar15 + (ulong)bVar19 * -0x10 + 8);
    }
  } while ((((pointer)local_770._40_8_ != pbVar5) || (local_770._24_8_ != 1)) ||
          (local_770._8_8_ != 0));
  local_5a8 = CONCAT44(local_c18.term_,local_c18.background_color.a);
  local_858._16_8_ = local_688 + 0x20;
  local_5c8 = CONCAT44(local_c18.foreground_color.r,local_c18.mode);
  uStack_5c0 = CONCAT44(local_c18.foreground_color.b,local_c18.foreground_color.g);
  local_5b8 = CONCAT44(local_c18.background_color.r,local_c18.foreground_color.a);
  uStack_5b0 = CONCAT44(local_c18.background_color.b,local_c18.background_color.g);
  local_688._32_8_ = (BrailleCanvas *)0x0;
  local_688._40_8_ = (block_t *)0x0;
  local_688._48_8_ = local_688._48_8_ & 0xffffffff00000000;
  local_650._M_current = (block_t *)0x3;
  local_648 = (Frame<plot::BrailleCanvas_*> *)anon_var_dwarf_8c8a;
  local_640 = 3;
  local_638 = (BrailleCanvas *)anon_var_dwarf_8c12;
  local_630._M_current = (block_t *)0x3;
  local_628 = (BrailleCanvas *)anon_var_dwarf_8ca2;
  local_620._M_current = (block_t *)0x3;
  local_618 = anon_var_dwarf_8c1e;
  local_610 = 3;
  local_608 = anon_var_dwarf_8c1e;
  local_600 = 3;
  local_5f8 = anon_var_dwarf_8cba;
  local_5f0 = 3;
  local_5e8 = anon_var_dwarf_8c12;
  local_5e0 = 3;
  local_5d8 = anon_var_dwarf_8cd2;
  local_688._0_8_ = (Margin<plot::Frame<plot::BrailleCanvas_*>_> *)0x1;
  local_688._8_8_ = 2;
  local_688._16_8_ = (Frame<plot::BrailleCanvas_*> *)0x0;
  local_688._24_8_ = 2;
  local_858._8_8_ = -1;
  local_858._24_8_ = -1;
  local_858._40_8_ =
       local_b98.blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_820._M_current =
       local_b98.blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_810 = 1;
  local_800._M_current =
       local_b98.blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_7f0._M_current =
       local_b98.blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_858._0_8_ = (Margin<plot::Frame<plot::BrailleCanvas_*>_> *)local_688;
  local_858._32_8_ = &local_b98;
  local_858._48_8_ = &local_b98;
  local_818 = (Frame<plot::BrailleCanvas_*> *)local_858._16_8_;
  local_808 = &local_b98;
  local_7f8 = &local_b98;
  local_5d0 = &local_b98;
  do {
    poVar8 = plot::detail::operator<<((ostream *)&std::cout,(value_type *)local_858);
    local_770[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_770,1);
    plot::detail::margin_line<plot::Frame<plot::BrailleCanvas_*>_>::next
              ((margin_line<plot::Frame<plot::BrailleCanvas_*>_> *)local_770,(value_type *)local_858
              );
    pbVar5 = local_b98.blocks_.
             super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
             .
             super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pMVar13 = (Margin<plot::Frame<plot::BrailleCanvas_*>_> *)local_770;
    pvVar15 = (value_type *)local_858;
    for (lVar6 = 0xe; lVar6 != 0; lVar6 = lVar6 + -1) {
      pvVar15->margin_ = (Margin<plot::Frame<plot::BrailleCanvas_*>_> *)pMVar13->top_;
      pMVar13 = (Margin<plot::Frame<plot::BrailleCanvas_*>_> *)
                ((long)pMVar13 + (ulong)bVar19 * -0x10 + 8);
      pvVar15 = (value_type *)((long)pvVar15 + (ulong)bVar19 * -0x10 + 8);
    }
  } while ((((pointer)local_858._40_8_ != pbVar4) || (local_858._24_8_ != 1)) ||
          (local_858._8_8_ != 0));
  local_690 = CONCAT44(local_c18.term_,local_c18.background_color.a);
  local_a28.line_.line_.frame_ = (Frame<plot::BrailleCanvas_*> *)(local_770 + 0x20);
  local_6b0 = CONCAT44(local_c18.foreground_color.r,local_c18.mode);
  uStack_6a8 = CONCAT44(local_c18.foreground_color.b,local_c18.foreground_color.g);
  local_6a0 = CONCAT44(local_c18.background_color.r,local_c18.foreground_color.a);
  uStack_698 = CONCAT44(local_c18.background_color.b,local_c18.background_color.g);
  local_770._32_8_ = (BrailleCanvas *)0x0;
  local_770._40_8_ = (block_t *)0x0;
  local_770._48_8_ = local_770._48_8_ & 0xffffffff00000000;
  local_738._M_current = (block_t *)0x3;
  local_730 = (Frame<plot::BrailleCanvas_*> *)anon_var_dwarf_8cea;
  local_728 = 3;
  local_720 = (BrailleCanvas *)anon_var_dwarf_8c2a;
  local_718._M_current = (block_t *)0x3;
  local_710 = (BrailleCanvas *)anon_var_dwarf_8cf6;
  local_708._M_current = (block_t *)0x3;
  local_700 = anon_var_dwarf_8c36;
  local_6f8 = 3;
  local_6f0 = anon_var_dwarf_8c36;
  local_6e8 = 3;
  local_6e0 = anon_var_dwarf_8d02;
  local_6d8 = 3;
  local_6d0 = anon_var_dwarf_8c2a;
  local_6c8 = 3;
  local_6c0 = anon_var_dwarf_8d0e;
  local_770._0_8_ = (Margin<plot::Frame<plot::BrailleCanvas_*>_> *)0x1;
  local_770._8_8_ = 2;
  local_770._16_8_ = (Frame<plot::BrailleCanvas_*> *)0x0;
  local_770._24_8_ = 2;
  local_a28.overflow_ = -1;
  local_a28.line_.line_.overflow_ = -1;
  local_a28.line_.line_.line_.line_.it_._M_current =
       local_b98.blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_a28.line_.line_.end_.line_.it_._M_current =
       local_b98.blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_a28.end_.line_.overflow_ = 1;
  local_a28.end_.line_.line_.line_.it_._M_current =
       local_b98.blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_a28.end_.line_.end_.line_.it_._M_current =
       local_b98.blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_a28.margin_ = (Margin<plot::Frame<plot::BrailleCanvas_*>_> *)local_770;
  local_a28.line_.line_.line_.line_.canvas_ = &local_b98;
  local_a28.line_.line_.end_.line_.canvas_ = &local_b98;
  local_a28.end_.line_.frame_ = local_a28.line_.line_.frame_;
  local_a28.end_.line_.line_.line_.canvas_ = &local_b98;
  local_a28.end_.line_.end_.line_.canvas_ = &local_b98;
  local_6b8 = &local_b98;
  do {
    poVar8 = plot::detail::operator<<((ostream *)&std::cout,&local_a28);
    local_858[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_858,1);
    plot::detail::margin_line<plot::Frame<plot::BrailleCanvas_*>_>::next
              ((margin_line<plot::Frame<plot::BrailleCanvas_*>_> *)local_858,&local_a28);
    pMVar13 = (Margin<plot::Frame<plot::BrailleCanvas_*>_> *)local_858;
    pvVar15 = &local_a28;
    for (lVar6 = 0xe; lVar6 != 0; lVar6 = lVar6 + -1) {
      pvVar15->margin_ = (Margin<plot::Frame<plot::BrailleCanvas_*>_> *)pMVar13->top_;
      pMVar13 = (Margin<plot::Frame<plot::BrailleCanvas_*>_> *)
                ((long)pMVar13 + (ulong)bVar19 * -0x10 + 8);
      pvVar15 = (value_type *)((long)pvVar15 + (ulong)bVar19 * -0x10 + 8);
    }
  } while (((local_a28.line_.line_.line_.line_.it_._M_current != pbVar5) ||
           (local_a28.line_.line_.overflow_ != 1)) || (local_a28.overflow_ != 0));
  local_778 = CONCAT44(local_c18.term_,local_c18.background_color.a);
  local_8c8.line_.line_.frame_ = (Frame<plot::BrailleCanvas_*> *)(local_858 + 0x20);
  local_798 = CONCAT44(local_c18.foreground_color.r,local_c18.mode);
  uStack_790 = CONCAT44(local_c18.foreground_color.b,local_c18.foreground_color.g);
  local_788 = CONCAT44(local_c18.background_color.r,local_c18.foreground_color.a);
  uStack_780 = CONCAT44(local_c18.background_color.b,local_c18.background_color.g);
  local_858._32_8_ = (BrailleCanvas *)0x0;
  local_858._40_8_ = (block_t *)0x0;
  local_858._48_8_ = local_858._48_8_ & 0xffffffff00000000;
  local_820._M_current = (block_t *)0x3;
  local_818 = (Frame<plot::BrailleCanvas_*> *)anon_var_dwarf_8c5a;
  local_810 = 3;
  local_808 = (BrailleCanvas *)anon_var_dwarf_8c42;
  local_800._M_current = (block_t *)0x3;
  local_7f8 = (BrailleCanvas *)anon_var_dwarf_8c66;
  local_7f0._M_current = (block_t *)0x3;
  local_7e8 = anon_var_dwarf_8c4e;
  local_7e0 = 3;
  local_7d8 = anon_var_dwarf_8c4e;
  local_7d0 = 3;
  local_7c8 = anon_var_dwarf_8c72;
  local_7c0 = 3;
  local_7b8 = anon_var_dwarf_8c42;
  local_7b0 = 3;
  local_7a8 = anon_var_dwarf_8c7e;
  local_858._0_8_ = (Margin<plot::Frame<plot::BrailleCanvas_*>_> *)0x1;
  local_858._8_8_ = 2;
  local_858._16_8_ = (Frame<plot::BrailleCanvas_*> *)0x1;
  local_858._24_8_ = 2;
  local_8c8.overflow_ = -1;
  local_8c8.line_.line_.overflow_ = -1;
  local_8c8.line_.line_.line_.line_.it_._M_current =
       local_b98.blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_8c8.line_.line_.end_.line_.it_._M_current =
       local_b98.blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_8c8.end_.line_.overflow_ = 1;
  local_8c8.end_.line_.line_.line_.it_._M_current =
       local_b98.blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_8c8.end_.line_.end_.line_.it_._M_current =
       local_b98.blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_8c8.margin_ = (Margin<plot::Frame<plot::BrailleCanvas_*>_> *)local_858;
  local_8c8.line_.line_.line_.line_.canvas_ = &local_b98;
  local_8c8.line_.line_.end_.line_.canvas_ = &local_b98;
  local_8c8.end_.line_.frame_ = local_8c8.line_.line_.frame_;
  local_8c8.end_.line_.line_.line_.canvas_ = &local_b98;
  local_8c8.end_.line_.end_.line_.canvas_ = &local_b98;
  local_7a0 = &local_b98;
  do {
    poVar8 = plot::detail::operator<<((ostream *)&std::cout,&local_8c8);
    local_a28.margin_ =
         (Margin<plot::Frame<plot::BrailleCanvas_*>_> *)CONCAT71(local_a28.margin_._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_a28,1);
    plot::detail::margin_line<plot::Frame<plot::BrailleCanvas_*>_>::next(&local_a28,&local_8c8);
    pmVar14 = &local_a28;
    pvVar15 = &local_8c8;
    for (lVar6 = 0xe; lVar6 != 0; lVar6 = lVar6 + -1) {
      pvVar15->margin_ = pmVar14->margin_;
      pmVar14 = (margin_line<plot::Frame<plot::BrailleCanvas_*>_> *)
                ((long)pmVar14 + (ulong)bVar19 * -0x10 + 8);
      pvVar15 = (value_type *)((long)pvVar15 + (ulong)bVar19 * -0x10 + 8);
    }
  } while (((local_8c8.line_.line_.line_.line_.it_._M_current !=
             local_b98.blocks_.
             super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
             .
             super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
             ._M_impl.super__Vector_impl_data._M_finish) || (local_8c8.line_.line_.overflow_ != 1))
          || (local_8c8.overflow_ != 1));
  std::ostream::flush();
  std::
  _Fwd_list_base<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>::
  ~_Fwd_list_base(&local_b98.available_layers_.
                   super__Fwd_list_base<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
                 );
  std::
  _Fwd_list_base<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>::
  ~_Fwd_list_base(&local_b98.stack_.
                   super__Fwd_list_base<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
                 );
  if (local_b98.blocks_.
      super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>.
      super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b98.blocks_.
                    super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                    .
                    super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b98.blocks_.
                          super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                          .
                          super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b98.blocks_.
                          super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                          .
                          super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main() {
    TerminalInfo term;
    term.detect();

    BrailleCanvas canvas({ 30, 7 }, term);

    Rect rect({ 0, 0 }, canvas.size() - Point(1, 2));
    auto size = rect.size() + Point(1, 1);

    auto y0 = rect.p1.y, A = size.y/2, N = size.x;
    float f = 2;

    canvas.stroke({ 0.2f, 0.2f, 1.0f }, rect, [y0,A,N,f](float x) {
              Coord base = y0 + A - std::lround(A*std::sin(2*3.141592f*f*x/N)),
                    end  = y0 + A - std::lround(A*std::sin(2*3.141592f*f*(x+1)/N));
              return (base != end) ? std::make_pair(base, end) : std::make_pair(base, base+1);
          })
          .stroke({ 1.0f, 0.4f, 0.4f }, rect, [y0,A,N,f](float x) {
              Coord base = y0 + A - std::lround(A*std::cos(2*3.141592f*f*x/N)),
                    end  = y0 + A - std::lround(A*std::cos(2*3.141592f*f*(x+1)/N));
              return (base != end) ? std::make_pair(base, end) : std::make_pair(base, base+1);
          })
          .line(term.foreground_color, { rect.p1.x, y0 + A }, { rect.p2.x, y0 + A }, TerminalOp::ClipSrc);

    std::cout << margin(1, 2, 0, 2, frame(BorderStyle::None, &canvas, term))
              << margin(1, 2, 0, 2, frame(u8"Label", &canvas, term))
              << margin(1, 2, 0, 2, frame(u8"Label", Align::Center, { BorderStyle::Solid, true }, &canvas, term))
              << margin(1, 2, 0, 2, frame(u8"Label", Align::Right, BorderStyle::SolidBold, &canvas, term))
              << margin(1, 2, 0, 2, frame(BorderStyle::Dashed, &canvas, term))
              << margin(1, 2, 0, 2, frame({ BorderStyle::Dashed, true }, &canvas, term))
              << margin(1, 2, 0, 2, frame(BorderStyle::DashedBold, &canvas, term))
              << margin(1, 2, 0, 2, frame(BorderStyle::Dotted, &canvas, term))
              << margin(1, 2, 0, 2, frame({ BorderStyle::Dotted, true }, &canvas, term))
              << margin(1, 2, 0, 2, frame(BorderStyle::DottedBold, &canvas, term))
              << margin(frame(BorderStyle::Double, &canvas, term)) << std::flush;

    return 0;
}